

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::ValidateConfig
                  (Error *__return_storage_ptr__,Config *aConfig)

{
  char cVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  writer write;
  writer write_1;
  Tlv commissionerIdTlv;
  undefined1 local_a0 [40];
  undefined1 local_78 [16];
  char *local_68;
  size_t local_60;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *local_58;
  parse_func local_50 [1];
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  tlv::Tlv::Tlv(&commissionerIdTlv,kCommissionerId,&aConfig->mId,kMeshCoP);
  if ((aConfig->mId)._M_string_length == 0) {
    local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
    local_78._8_8_ = "commissioner ID is mandatory";
    local_68 = (char *)0x1c;
    local_60 = 0;
    local_50[0] = (parse_func)0x0;
    pcVar5 = "commissioner ID is mandatory";
    local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_78);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_78;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&write_1,(v10 *)"commissioner ID is mandatory",(string_view)ZEXT816(0x1c),
               args);
    local_a0._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&write_1);
  }
  else {
    bVar4 = tlv::Tlv::IsValid(&commissionerIdTlv);
    if (bVar4) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&commissionerIdTlv.mValue.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (0xf < aConfig->mKeepAliveInterval - 0x1e) {
        local_78._0_8_ = 0x200000002;
        local_78._8_4_ = 2;
        local_68 = "keep-alive internal {} exceeds range [{}, {}]";
        local_60 = 0x2d;
        local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                   0x300000000;
        local_48 = ::fmt::v10::detail::
                   parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
        pcStack_40 = ::fmt::v10::detail::
                     parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
        local_38 = ::fmt::v10::detail::
                   parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
        pcVar5 = "keep-alive internal {} exceeds range [{}, {}]";
        write_1.handler_ =
             (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
        local_50[0] = (parse_func)local_78;
        while (pcVar5 != "") {
          cVar1 = *pcVar5;
          pcVar6 = pcVar5;
          while (cVar1 != '{') {
            pcVar6 = pcVar6 + 1;
            if (pcVar6 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int,_unsigned_int>_>
              ::writer::operator()(&write_1,pcVar5,"");
              goto LAB_0019136d;
            }
            cVar1 = *pcVar6;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int,_unsigned_int>_>
          ::writer::operator()(&write_1,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int,unsigned_int,unsigned_int>&>
                             (pcVar6,"",
                              (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                               *)local_78);
        }
LAB_0019136d:
        local_78._0_8_ = ZEXT48(aConfig->mKeepAliveInterval);
        local_68 = (char *)0x1e;
        local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)0x2d;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_78;
        fmt_00.size_ = 0x222;
        fmt_00.data_ = (char *)0x2d;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&commissionerIdTlv,
                   (v10 *)"keep-alive internal {} exceeds range [{}, {}]",fmt_00,args_01);
        local_a0._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&commissionerIdTlv);
LAB_001913bc:
        Error::operator=(__return_storage_ptr__,(Error *)local_a0);
        std::__cxx11::string::~string((string *)(local_a0 + 8));
        std::__cxx11::string::~string((string *)&commissionerIdTlv);
        return __return_storage_ptr__;
      }
      if (aConfig->mEnableCcm != true) {
        puVar2 = (aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar2 == puVar3) {
          local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
          local_78._8_8_ = "missing PSKc for non-CCM network";
          local_68 = (char *)0x20;
          local_60 = 0;
          local_50[0] = (parse_func)0x0;
          pcVar5 = "missing PSKc for non-CCM network";
          write_1.handler_ =
               (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_78;
          local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                     local_78;
          while (pcVar5 != "") {
            cVar1 = *pcVar5;
            pcVar6 = pcVar5;
            while (cVar1 != '{') {
              pcVar6 = pcVar6 + 1;
              if (pcVar6 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()((writer *)&write_1,pcVar5,"");
                goto LAB_001915a7;
              }
              cVar1 = *pcVar6;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&write_1,pcVar5,pcVar6);
            pcVar5 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar6,"",
                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_78);
          }
LAB_001915a7:
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)local_78;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&commissionerIdTlv,(v10 *)"missing PSKc for non-CCM network",
                     (string_view)ZEXT816(0x20),args_02);
          local_a0._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&commissionerIdTlv);
        }
        else {
          if ((ulong)((long)puVar3 - (long)puVar2) < 0x11) {
            return __return_storage_ptr__;
          }
          local_78._0_4_ = ulong_long_type;
          local_78._8_8_ = "PSKc is too long (length={})";
          local_68 = (char *)0x1c;
          local_60 = 0x100000000;
          local_50[0] = ::fmt::v10::detail::
                        parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar5 = "PSKc is too long (length={})";
          local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                     local_78;
          while (pcVar6 = pcVar5, pcVar6 != "") {
            pcVar5 = pcVar6 + 1;
            if (*pcVar6 == '}') {
              if ((pcVar5 == "") || (*pcVar5 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar5 = pcVar6 + 2;
            }
            else if (*pcVar6 == '{') {
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                                 (pcVar6,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_78);
            }
          }
          local_78._0_8_ =
               (long)(aConfig->mPSKc).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(aConfig->mPSKc).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)local_78;
          fmt_01.size_ = 4;
          fmt_01.data_ = (char *)0x1c;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&commissionerIdTlv,(v10 *)"PSKc is too long (length={})",fmt_01,
                     args_04);
          local_a0._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&commissionerIdTlv);
        }
        goto LAB_001913bc;
      }
      tlv::Tlv::Tlv(&commissionerIdTlv,kDomainName,&aConfig->mDomainName,kMeshCoP);
      if ((aConfig->mDomainName)._M_string_length == 0) {
        local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
        local_78._8_8_ = "missing Domain Name for CCM network";
        local_68 = (char *)0x23;
        local_60 = 0;
        local_50[0] = (parse_func)0x0;
        pcVar5 = "missing Domain Name for CCM network";
        write.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78;
        local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                   local_78;
        while (pcVar5 != "") {
          cVar1 = *pcVar5;
          pcVar6 = pcVar5;
          while (cVar1 != '{') {
            pcVar6 = pcVar6 + 1;
            if (pcVar6 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar5,"");
              goto LAB_001915f3;
            }
            cVar1 = *pcVar6;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&write,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar6,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_78);
        }
LAB_001915f3:
        args_03.field_1.values_ = in_R9.values_;
        args_03.desc_ = (unsigned_long_long)local_78;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&write_1,(v10 *)"missing Domain Name for CCM network",
                   (string_view)ZEXT816(0x23),args_03);
        local_a0._0_4_ = kInvalidArgs;
        std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&write_1);
      }
      else {
        bVar4 = tlv::Tlv::IsValid(&commissionerIdTlv);
        if (bVar4) {
          if ((aConfig->mPrivateKey).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (aConfig->mPrivateKey).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
            local_78._8_8_ = "missing Private Key file for CCM network";
            local_68 = (char *)0x28;
            local_60 = 0;
            local_50[0] = (parse_func)0x0;
            pcVar5 = "missing Private Key file for CCM network";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78;
            local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                       local_78;
            while (pcVar5 != "") {
              cVar1 = *pcVar5;
              pcVar6 = pcVar5;
              while (cVar1 != '{') {
                pcVar6 = pcVar6 + 1;
                if (pcVar6 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()((writer *)&write,pcVar5,"");
                  goto LAB_001917e4;
                }
                cVar1 = *pcVar6;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar5,pcVar6);
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar6,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_78);
            }
LAB_001917e4:
            args_06.field_1.values_ = in_R9.values_;
            args_06.desc_ = (unsigned_long_long)local_78;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&write_1,(v10 *)"missing Private Key file for CCM network",
                       (string_view)ZEXT816(0x28),args_06);
            local_a0._0_4_ = kInvalidArgs;
            std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&write_1);
          }
          else if ((aConfig->mCertificate).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   (aConfig->mCertificate).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
            local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
            local_78._8_8_ = "missing Certificate file for CCM network";
            local_68 = (char *)0x28;
            local_60 = 0;
            local_50[0] = (parse_func)0x0;
            pcVar5 = "missing Certificate file for CCM network";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78;
            local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                       local_78;
            while (pcVar5 != "") {
              cVar1 = *pcVar5;
              pcVar6 = pcVar5;
              while (cVar1 != '{') {
                pcVar6 = pcVar6 + 1;
                if (pcVar6 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()((writer *)&write,pcVar5,"");
                  goto LAB_001918aa;
                }
                cVar1 = *pcVar6;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar5,pcVar6);
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar6,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_78);
            }
LAB_001918aa:
            args_07.field_1.values_ = in_R9.values_;
            args_07.desc_ = (unsigned_long_long)local_78;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&write_1,(v10 *)"missing Certificate file for CCM network",
                       (string_view)ZEXT816(0x28),args_07);
            local_a0._0_4_ = kInvalidArgs;
            std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&write_1);
          }
          else {
            if ((aConfig->mTrustAnchor).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (aConfig->mTrustAnchor).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_001912a1;
            local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
            local_78._8_8_ = "missing Trust Anchor file for CCM network";
            local_68 = (char *)0x29;
            local_60 = 0;
            local_50[0] = (parse_func)0x0;
            pcVar5 = "missing Trust Anchor file for CCM network";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78;
            local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                       local_78;
            while (pcVar5 != "") {
              cVar1 = *pcVar5;
              pcVar6 = pcVar5;
              while (cVar1 != '{') {
                pcVar6 = pcVar6 + 1;
                if (pcVar6 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()((writer *)&write,pcVar5,"");
                  goto LAB_001918f6;
                }
                cVar1 = *pcVar6;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar5,pcVar6);
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar6,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_78);
            }
LAB_001918f6:
            args_08.field_1.args_ = in_R9.args_;
            args_08.desc_ = (unsigned_long_long)local_78;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&write_1,(v10 *)"missing Trust Anchor file for CCM network",
                       (string_view)ZEXT816(0x29),args_08);
            local_a0._0_4_ = kInvalidArgs;
            std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&write_1);
          }
        }
        else {
          local_78._0_4_ = ulong_long_type;
          local_78._8_8_ = "Domain Name is too long (length={})";
          local_68 = (char *)0x23;
          local_60 = 0x100000000;
          local_50[0] = ::fmt::v10::detail::
                        parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar5 = "Domain Name is too long (length={})";
          write.handler_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78;
          local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                     local_78;
          while (pcVar5 != "") {
            cVar1 = *pcVar5;
            pcVar6 = pcVar5;
            while (cVar1 != '{') {
              pcVar6 = pcVar6 + 1;
              if (pcVar6 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
                ::writer::operator()((writer *)&write,pcVar5,"");
                goto LAB_00191716;
              }
              cVar1 = *pcVar6;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
            ::writer::operator()((writer *)&write,pcVar5,pcVar6);
            pcVar5 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                               (pcVar6,"",
                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_78);
          }
LAB_00191716:
          local_78._0_8_ = (aConfig->mDomainName)._M_string_length;
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)local_78;
          fmt_02.size_ = 4;
          fmt_02.data_ = (char *)0x23;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&write_1,(v10 *)"Domain Name is too long (length={})",fmt_02,args_05)
          ;
          local_a0._0_4_ = kInvalidArgs;
          std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&write_1);
        }
      }
    }
    else {
      local_78._0_4_ = string_type;
      local_78._8_8_ = "{} is not a valid Commissioner ID";
      local_68 = (char *)0x21;
      local_60 = 0x100000000;
      local_50[0] = ::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar5 = "{} is not a valid Commissioner ID";
      write.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_78;
      local_58 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                 local_78;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write,pcVar5,"");
            goto LAB_00191243;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_78);
      }
LAB_00191243:
      local_78._0_8_ = (aConfig->mId)._M_dataplus._M_p;
      local_78._8_8_ = (aConfig->mId)._M_string_length;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_78;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x21;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&write_1,(v10 *)"{} is not a valid Commissioner ID",fmt,args_00);
      local_a0._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&write_1);
    }
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_a0);
  std::__cxx11::string::~string((string *)(local_a0 + 8));
  std::__cxx11::string::~string((string *)&write_1);
LAB_001912a1:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&commissionerIdTlv.mValue.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::ValidateConfig(const Config &aConfig)
{
    Error error;

    {
        tlv::Tlv commissionerIdTlv{tlv::Type::kCommissionerId, aConfig.mId};
        VerifyOrExit(!aConfig.mId.empty(), error = ERROR_INVALID_ARGS("commissioner ID is mandatory"));
        VerifyOrExit(commissionerIdTlv.IsValid(),
                     error = ERROR_INVALID_ARGS("{} is not a valid Commissioner ID", aConfig.mId));
    }

    VerifyOrExit(
        (aConfig.mKeepAliveInterval >= kMinKeepAliveInterval && aConfig.mKeepAliveInterval <= kMaxKeepAliveInterval),
        error = ERROR_INVALID_ARGS("keep-alive internal {} exceeds range [{}, {}]", aConfig.mKeepAliveInterval,
                                   kMinKeepAliveInterval, kMaxKeepAliveInterval));

    if (aConfig.mEnableCcm)
    {
        tlv::Tlv domainNameTlv{tlv::Type::kDomainName, aConfig.mDomainName};

#if !OT_COMM_CONFIG_CCM_ENABLE
        ExitNow(error = ERROR_INVALID_ARGS(CCM_NOT_IMPLEMENTED));
#endif

        VerifyOrExit(!aConfig.mDomainName.empty(), error = ERROR_INVALID_ARGS("missing Domain Name for CCM network"));
        VerifyOrExit(domainNameTlv.IsValid(),
                     error = ERROR_INVALID_ARGS("Domain Name is too long (length={})", aConfig.mDomainName.size()));
        VerifyOrExit(!aConfig.mPrivateKey.empty(),
                     error = ERROR_INVALID_ARGS("missing Private Key file for CCM network"));
        VerifyOrExit(!aConfig.mCertificate.empty(),
                     error = ERROR_INVALID_ARGS("missing Certificate file for CCM network"));
        VerifyOrExit(!aConfig.mTrustAnchor.empty(),
                     error = ERROR_INVALID_ARGS("missing Trust Anchor file for CCM network"));
    }
    else
    {
        // Should we also enable setting PSKc from passphrase?
        VerifyOrExit(!aConfig.mPSKc.empty(), error = ERROR_INVALID_ARGS("missing PSKc for non-CCM network"));
        VerifyOrExit(aConfig.mPSKc.size() <= kMaxPSKcLength,
                     error = ERROR_INVALID_ARGS("PSKc is too long (length={})", aConfig.mPSKc.size()));
    }

exit:
    return error;
}